

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.cpp
# Opt level: O2

void __thiscall
AmsConnection::AmsConnection(AmsConnection *this,Router *__router,addrinfo *destination)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  thread tStack_48;
  AmsConnection *local_40;
  code *local_38;
  undefined8 local_30;
  
  this->router = __router;
  TcpSocket::TcpSocket(&this->socket,destination);
  (this->receiver)._M_id._M_thread = 0;
  (this->refCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->invokeId).super___atomic_base<unsigned_int>._M_i = 0;
  std::array<AmsResponse,_128UL>::array(&this->queue);
  (this->dispatcherList)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dispatcherList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->dispatcherList)._M_t._M_impl.super__Rb_tree_header;
  (this->dispatcherList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dispatcherList)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->dispatcherListMutex).super___recursive_mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->dispatcherListMutex).super___recursive_mutex_base._M_mutex + 0x10) =
       0;
  (this->dispatcherList)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dispatcherListMutex).super___recursive_mutex_base._M_mutex.__align = 0;
  (this->dispatcherListMutex).super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->dispatcherListMutex).super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->dispatcherListMutex).super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  uVar2 = TcpSocket::Connect(&this->socket);
  this->ownIp = uVar2;
  local_38 = TryRecv;
  local_30 = 0;
  local_40 = this;
  std::thread::thread<void(AmsConnection::*)(),AmsConnection*,void>
            (&tStack_48,(type *)&local_38,&local_40);
  std::thread::operator=(&this->receiver,&tStack_48);
  std::thread::~thread(&tStack_48);
  return;
}

Assistant:

AmsConnection::AmsConnection(Router& __router, const struct addrinfo* const destination)
    : router(__router),
    socket(destination),
    refCount(0),
    invokeId(0),
    ownIp(socket.Connect())
{
    receiver = std::thread(&AmsConnection::TryRecv, this);
}